

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O0

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
solver1M1P<float>(vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                  *__return_storage_ptr__,
                 vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                 *ptPair,vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
                         *plPair,
                 vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                 *lPair,vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
                        *lCPair)

{
  Scalar SVar1;
  size_type sVar2;
  ostream *this;
  reference pvVar3;
  reference pvVar4;
  DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *this_00;
  reference pvVar5;
  MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *pMVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar9;
  MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *this_01;
  float extraout_XMM0_Da;
  double dVar10;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> PVar11;
  XprTypeNested local_1420;
  XprTypeNested local_1418;
  XprTypeNested local_1410;
  Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>
  local_1408;
  Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>
  local_13f8;
  Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_13e0;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_13c0;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>
  local_1398;
  undefined1 local_1368 [8];
  Matrix<float,_4,_4,_0,_4,_4> sol;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_12eb [3];
  Matrix<float,4,4,0,4,4> local_12e8 [8];
  Matrix<float,_4,_4,_0,_4,_4> TV2;
  Scalar local_129c;
  Scalar local_1298;
  Scalar local_1294;
  Scalar local_1290;
  Scalar local_128c;
  Scalar local_1288;
  Scalar local_1284;
  Scalar local_1280;
  Scalar local_127c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_1278;
  undefined1 local_1254 [8];
  Matrix<float,_3,_3,_0,_3,_3> V2;
  float alpha2;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_1208;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
  local_11d4 [8];
  Matrix<float,_3,_1,_0,_3,_1> w2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_118b [3];
  Matrix<float,4,4,0,4,4> local_1188 [8];
  Matrix<float,_4,_4,_0,_4,_4> TV1;
  Scalar local_113c;
  Scalar local_1138;
  Scalar local_1134;
  Scalar local_1130;
  Scalar local_112c;
  Scalar local_1128;
  Scalar local_1124;
  Scalar local_1120;
  Scalar local_111c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_1118;
  undefined1 local_10f4 [8];
  Matrix<float,_3,_3,_0,_3,_3> V1;
  float alpha1;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_10a8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
  local_1074 [8];
  Matrix<float,_3,_1,_0,_3,_1> w;
  Type local_1030;
  Type local_ff8;
  Type local_fc0;
  Type local_f88;
  Type local_f50;
  non_const_type local_f18;
  XprTypeNested local_f10;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_f08;
  Matrix<float,4,1,0,4,1> local_ef8 [8];
  Matrix<float,_4,_1,_0,_4,_1> Nuu;
  XprTypeNested local_ee0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_ed8;
  Matrix<float,4,1,0,4,1> local_ec8 [8];
  Matrix<float,_4,_1,_0,_4,_1> Piu;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_eb0;
  Matrix<float,6,1,0,6,1> local_ea0 [8];
  Matrix<float,_6,_1,_0,_6,_1> lu2;
  Matrix<float,6,1,0,6,1> local_e78 [8];
  Matrix<float,_6,_1,_0,_6,_1> lu1;
  Matrix<float,_3,_1,_0,_3,_1> local_e28;
  Matrix<float,_3,_3,_0,_3,_3> local_e1c;
  NegativeReturnType local_df8;
  Type local_de8;
  Matrix<float,_3,_1,_0,_3,_1> local_db0;
  Matrix<float,_3,_3,_0,_3,_3> local_da4;
  NegativeReturnType local_d80;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_d6b [3];
  Matrix<float,6,6,0,6,6> local_d68 [8];
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_ccb [3];
  Matrix<float,6,6,0,6,6> local_cc8 [8];
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_bfb [3];
  Matrix<float,4,4,0,4,4> local_bf8 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  local_b7b [3];
  Matrix<float,4,4,0,4,4> local_b78 [8];
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  ReturnType_conflict local_b2c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  local_b28;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_b04 [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_af8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_ac8;
  undefined1 local_a80 [8];
  Matrix<float,_3,_1,_0,_3,_1> p2;
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> local_a4c [12];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_a40;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_a10;
  undefined1 local_9c4 [8];
  Matrix<float,_3,_1,_0,_3,_1> p1;
  Matrix<float,3,1,0,3,1> local_97c [8];
  Matrix<float,_3,_1,_0,_3,_1> n2;
  Matrix<float,3,1,0,3,1> local_934 [8];
  Matrix<float,_3,_1,_0,_3,_1> n1;
  Matrix<float,3,1,0,3,1> local_8ec [8];
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,3,1,0,3,1> local_8a4 [8];
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  Matrix<float,3,1,0,3,1> local_85c [8];
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,3,1,0,3,1> local_814 [8];
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  XprTypeNested local_800;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_7f8;
  Matrix<float,4,1,0,4,1> local_7e8 [8];
  Matrix<float,_4,_1,_0,_4,_1> NuU;
  XprTypeNested local_7d0;
  Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>
  local_7c8;
  Matrix<float,4,1,0,4,1> local_7b8 [8];
  Matrix<float,_4,_1,_0,_4,_1> PiU;
  Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> local_7a0;
  Matrix<float,6,1,0,6,1> local_790 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU2;
  Matrix<float,6,1,0,6,1> local_768 [8];
  Matrix<float,_6,_1,_0,_6,_1> lU1;
  Type local_718;
  Type local_6e0;
  Matrix<float,_3,_1,_0,_3,_1> local_6a8;
  Matrix<float,_3,_3,_0,_3,_3> local_69c;
  NegativeReturnType local_678;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_668;
  Type local_620;
  Type local_5e8;
  Type local_5b0;
  Type local_578;
  Type local_540;
  Type local_508;
  Type local_4d0;
  Matrix<float,_3,_1,_0,_3,_1> local_498;
  Matrix<float,_3,_3,_0,_3,_3> local_48c;
  NegativeReturnType local_468;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_458;
  Type local_410;
  Type local_3d8;
  Type local_3a0;
  Type local_368;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_32b [3];
  Matrix<float,6,6,0,6,6> local_328 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
  local_28b [3];
  Matrix<float,6,6,0,6,6> local_288 [8];
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_1,_0,_4,_1> local_168;
  undefined1 local_158 [8];
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  predTrans;
  Type local_138;
  Type local_100;
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_c8;
  undefined1 local_80 [8];
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<float,_4,_1,_0,_4,_1> Nu;
  undefined1 local_48 [8];
  Matrix<float,_4,_1,_0,_4,_1> Pi;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lCPair_local;
  vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
  *lPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *plPair_local;
  vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
  *ptPair_local;
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  *out;
  
  sVar2 = std::
          vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
          ::size(lCPair);
  if (sVar2 == 0) {
    sVar2 = std::
            vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
            ::size(plPair);
    if (sVar2 < 2) {
      this = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
  }
  Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._3_1_ = 0
  ;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::clear(__return_storage_ptr__);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix((Matrix<float,_4,_1,_0,_4,_1> *)local_48);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
            ((Matrix<float,_4,_1,_0,_4,_1> *)
             &lines1.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::
           vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
           ::operator[](plPair,0);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
            ((Matrix<float,_4,_1,_0,_4,_1> *)local_48,&pvVar3->first);
  pvVar3 = std::
           vector<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>
           ::operator[](plPair,0);
  Eigen::Matrix<float,_4,_1,_0,_4,_1>::operator=
            ((Matrix<float,_4,_1,_0,_4,_1> *)
             &lines1.
              super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&pvVar3->second);
  pvVar4 = std::
           vector<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>_>_>
           ::operator[](lCPair,0);
  std::
  pair<std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::pair(&local_c8,pvVar4);
  getPluckerCoord<float>
            ((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
              *)local_80,&local_c8);
  Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
            (&local_100,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_48,3);
  this_00 = (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
            std::
            vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
            ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                          *)local_80,0);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>(&local_138,this_00,3);
  this_01 = (MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>> *)&local_100;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,-1,1,false>>::
  dot<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            (this_01,(MatrixBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *
                     )&local_138);
  std::abs((int)this_01);
  if (1e-06 <= extraout_XMM0_Da) {
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&local_168,(Matrix<float,_4,_1,_0,_4,_1> *)local_48)
    ;
    Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
              ((Matrix<float,_4,_1,_0,_4,_1> *)
               (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),
               (Matrix<float,_4,_1,_0,_4,_1> *)
               &lines1.
                super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    getPredefinedTransformations1Plane3Line<float>
              ((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_158,&local_168,
               (Matrix<float,_4,_1,_0,_4,_1> *)
               (TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),false);
    pvVar5 = std::
             vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                     *)local_158);
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<float,_4,_4,_0,_4,_4> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),pvVar5);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_158);
    pvVar5 = std::
             vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
             ::back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                     *)local_158);
    Eigen::Matrix<float,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<float,_4,_4,_0,_4,_4> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),pvVar5);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::pop_back((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)local_158);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<float,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (local_288,local_28b);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<float,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (local_328,local_32b);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_368,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_3a0,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_288,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_3a0,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_368);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_3d8,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              (&local_410,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_288,3,3,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_410,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_3d8);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_4d0,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,1);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Matrix<float,3,1,0,3,1> *)&local_498,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_4d0);
    getSkew<float>(&local_48c,&local_498);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
              (&local_468,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_48c);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_508,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
    ::operator*(&local_458,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
                 *)&local_468,
                (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_508);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              (&local_540,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_288,3,0,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_540,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_458);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_578,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
              (&local_5b0,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_328,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_5b0,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_578);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_5e8,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),3,3);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              (&local_620,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_328,3,3,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_620,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_5e8);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              (&local_6e0,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),3,1);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>>
              ((Matrix<float,3,1,0,3,1> *)&local_6a8,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
               &local_6e0);
    getSkew<float>(&local_69c,&local_6a8);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
              (&local_678,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_69c);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              (&local_718,
               (DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)
               (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),3,3);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
    ::operator*(&local_668,
                (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
                 *)&local_678,
                (MatrixBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_718);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              ((Type *)(lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + 4),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_328,3,0
               ,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
               (lU1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 4),
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>_>
                *)&local_668);
    pMVar6 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             std::
             vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                           *)local_80,0);
    PVar11 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_288,pMVar6);
    lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar11.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (local_768,
               (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(lU2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    pMVar6 = (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)
             std::
             vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                           *)local_80,1);
    local_7a0 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                          ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_328,pMVar6);
    Eigen::Matrix<float,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (local_790,
               (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&local_7a0);
    NuU.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                   ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                    (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                     m_data.array + 0x22));
    local_7d0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                    (NuU.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 2));
    local_7c8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                             *)&local_7d0,
                            (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_48);
    Eigen::Matrix<float,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              (local_7b8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&local_7c8);
    dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ =
         Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                   ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                    (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                     m_data.array + 0xe));
    local_800.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                    (dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array + 1));
    local_7f8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                             *)&local_800,
                            (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)
                            &lines1.
                             super__Vector_base<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Eigen::Matrix<float,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              (local_7e8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&local_7f8);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_768,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (local_814,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)(dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_768,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (local_85c,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              ((Type *)(m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_790,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (local_8a4,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              ((Type *)(n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_790,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
              (local_8ec,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               (n1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_7b8,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              (local_934,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (n2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_7e8,3);
    Eigen::Matrix<float,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,_1,1,false>>
              (local_97c,
               (EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (p1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_a4c,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_934);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_7b8,3);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)(p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + 2),pSVar7,(StorageBaseType *)local_814);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_a40,local_a4c,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)(p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
    p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::dot<Eigen::Matrix<float,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_934,
                    (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_814);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
    ::operator/(&local_a10,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
                 *)&local_a40,
                p2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1);
    Eigen::Matrix<float,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((Matrix<float,3,1,0,3,1> *)local_9c4,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&local_a10);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::cross<Eigen::Matrix<float,3,1,0,3,1>>
              (local_b04,(MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_97c);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)local_7e8,3);
    Eigen::operator*(&local_b28,pSVar7,(StorageBaseType *)local_8a4);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_af8,local_b04,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&local_b28);
    local_b2c = Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::
                dot<Eigen::Matrix<float,3,1,0,3,1>>
                          ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_97c,
                           (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_8a4);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
    ::operator/(&local_ac8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
                 *)&local_af8,&local_b2c);
    Eigen::Matrix<float,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((Matrix<float,3,1,0,3,1> *)local_a80,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&local_ac8);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              (local_b78,local_b7b);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)(Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xe),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_b78,3
               ,1);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
               (Tu2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_9c4);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              (local_bf8,local_bfb);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
              ((Type *)(TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.
                        m_data.array + 0x22),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_bf8,
               3,1);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
               (TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                array + 0x22),(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_a80);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<float,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (local_cc8,local_ccb);
    Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::Matrix<float,6,6,0,6,6>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
              (local_d68,local_d6b);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
              (&local_db0,(Matrix<float,_3,_1,_0,_3,_1> *)local_9c4);
    getSkew<float>(&local_da4,&local_db0);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
              (&local_d80,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_da4);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              (&local_de8,(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_cc8,3,0,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)&local_de8,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                *)&local_d80);
    Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix
              (&local_e28,(Matrix<float,_3,_1,_0,_3,_1> *)local_a80);
    getSkew<float>(&local_e1c,&local_e28);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator-
              (&local_df8,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)&local_e1c);
    Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::block<int,int>
              ((Type *)(lu1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.
                        m_data.array + 4),(DenseBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_d68,3,0
               ,3,3);
    Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false> *)
               (lu1.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                array + 4),
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>_>
                *)&local_df8);
    PVar11 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                       ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_cc8,
                        (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_768);
    lu2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.array._16_8_ =
         PVar11.m_lhs;
    Eigen::Matrix<float,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (local_e78,
               (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)(lu2.super_PlainObjectBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                   array + 4));
    local_eb0 = Eigen::MatrixBase<Eigen::Matrix<float,6,6,0,6,6>>::operator*
                          ((MatrixBase<Eigen::Matrix<float,6,6,0,6,6>> *)local_d68,
                           (MatrixBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_790);
    Eigen::Matrix<float,6,1,0,6,1>::
    Matrix<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
              (local_ea0,
               (EigenBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
                *)&local_eb0);
    Nuu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array._8_8_ =
         Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                   ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_b78);
    local_ee0.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                    (Nuu.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                     m_data.array + 2));
    local_ed8 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                             *)&local_ee0,
                            (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_7b8);
    Eigen::Matrix<float,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              (local_ec8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&local_ed8);
    local_f18 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::transpose
                          ((DenseBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_bf8);
    local_f10.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                    &local_f18);
    local_f08 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                ::operator*((MatrixBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>>
                             *)&local_f10,
                            (MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_7e8);
    Eigen::Matrix<float,4,1,0,4,1>::
    Matrix<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,4,4,0,4,4>>>,Eigen::Matrix<float,4,1,0,4,1>,0>>
              (local_ef8,
               (EigenBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<float,_4,_1,_0,_4,_1>,_0>_>
                *)&local_f08);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              (&local_f50,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_e78,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_814,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_f50);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_f88,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_e78,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_85c,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_f88);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
              (&local_fc0,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_ea0,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_8a4,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_fc0);
    Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
              (&local_ff8,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)local_ea0,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_8ec,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               &local_ff8);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              (&local_1030,(DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_ec8,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_934,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               &local_1030);
    Eigen::DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::head<int>
              ((Type *)(w.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),
               (DenseBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)local_ef8,3);
    Eigen::Matrix<float,3,1,0,3,1>::operator=
              (local_97c,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
               (w.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 1));
    V1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::dot<Eigen::Matrix<float,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_814,
                    (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_934);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&alpha1,
                     V1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                     .array + 8,(StorageBaseType *)local_934);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_10a8,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_814,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&alpha1);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::normalized(local_1074);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_1074,1);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_1074,0);
    dVar10 = std::atan2((double)(ulong)(uint)SVar1,(double)(ulong)(uint)*pSVar8);
    V1.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         SUB84(dVar10,0);
    Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_10f4);
    dVar10 = std::cos((double)(ulong)(uint)V1.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_111c = SUB84(dVar10,0);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
              (&local_1118,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_10f4,&local_111c
              );
    dVar10 = std::sin((double)(ulong)(uint)V1.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_1120 = SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (&local_1118,&local_1120);
    local_1124 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1124);
    dVar10 = std::sin((double)(ulong)(uint)V1.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_1128 = -SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1128);
    dVar10 = std::cos((double)(ulong)(uint)V1.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_112c = SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_112c);
    local_1130 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1130);
    local_1134 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1134);
    local_1138 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1138);
    local_113c = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar9,&local_113c);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1118);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              (local_1188,local_118b);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)(w2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 1),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_1188,3,
               3);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
               (w2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_10f4);
    V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::dot<Eigen::Matrix<float,3,1,0,3,1>>
                   ((MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_8a4,
                    (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_97c);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                      *)&alpha2,
                     V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
                     .array + 8,(StorageBaseType *)local_97c);
    Eigen::MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator-
              (&local_1208,(MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)local_8a4,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                *)&alpha2);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::normalized(local_11d4);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_11d4,1);
    SVar1 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)local_11d4,0);
    dVar10 = std::atan2((double)(ulong)(uint)SVar1,(double)(ulong)(uint)*pSVar8);
    V2.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         SUB84(dVar10,0);
    Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix((Matrix<float,_3,_3,_0,_3,_3> *)local_1254);
    dVar10 = std::cos((double)(ulong)(uint)V2.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_127c = SUB84(dVar10,0);
    Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
              (&local_1278,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_1254,&local_127c
              );
    dVar10 = std::sin((double)(ulong)(uint)V2.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_1280 = SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (&local_1278,&local_1280);
    local_1284 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1284);
    dVar10 = std::sin((double)(ulong)(uint)V2.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_1288 = -SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1288);
    dVar10 = std::cos((double)(ulong)(uint)V2.
                                           super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
                                           .m_storage.m_data.array[7]);
    local_128c = SUB84(dVar10,0);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_128c);
    local_1290 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1290);
    local_1294 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1294);
    local_1298 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar9,&local_1298);
    local_129c = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar9,&local_129c);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_1278);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              (local_12e8,local_12eb);
    Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
              ((Type *)(sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                        m_data.array + 0xe),(DenseBase<Eigen::Matrix<float,4,4,0,4,4>> *)local_12e8,
               3,3);
    Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false> *)
               (sol.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xe),(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_1254);
    local_1410 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                            (TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array + 0xe));
    local_1418 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_bf8);
    local_1408 = Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>>::operator*
                           ((MatrixBase<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>> *)
                            &local_1410,
                            (MatrixBase<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)
                            &local_1418);
    local_1420 = (XprTypeNested)
                 Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::inverse
                           ((MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_12e8);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
    ::operator*(&local_13f8,
                (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
                 *)&local_1408,
                (MatrixBase<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *)&local_1420);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
    ::operator*(&local_13e0,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>>
                 *)&local_13f8,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_1188);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
    ::operator*(&local_13c0,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                 *)&local_13e0,(MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)local_b78);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
    ::operator*(&local_1398,
                (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
                 *)&local_13c0,
                (MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_> *)
                (TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.
                 array + 0x22));
    Eigen::Matrix<float,4,4,0,4,4>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<float,4,4,0,4,4>>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>,Eigen::Matrix<float,4,4,0,4,4>,0>>
              ((Matrix<float,4,4,0,4,4> *)local_1368,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
                *)&local_1398);
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_1368);
    Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._3_1_ =
         1;
    predTrans.
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
               *)local_158);
  }
  else {
    Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._3_1_ =
         1;
    predTrans.
    super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  std::
  vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>_>
             *)local_80);
  if ((Pi.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3].
       _3_1_ & 1) == 0) {
    std::
    vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}